

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::CharN
          (AsciiParser *this,size_t n,vector<char,_std::allocator<char>_> *nc)

{
  StreamReader *this_00;
  char *__nbytes;
  ssize_t sVar1;
  allocator_type local_39;
  undefined1 local_38 [6];
  bool ok;
  vector<char,_std::allocator<char>_> buf;
  vector<char,_std::allocator<char>_> *nc_local;
  size_t n_local;
  AsciiParser *this_local;
  
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = nc;
  ::std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_38,n,&local_39);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  this_00 = this->_sr;
  __nbytes = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_38);
  sVar1 = StreamReader::read(this_00,(int)n,(void *)n,(size_t)__nbytes);
  if (sVar1 != 0) {
    ::std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)
               buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
               (vector<char,_std::allocator<char>_> *)local_38);
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_38)
  ;
  return sVar1 != 0;
}

Assistant:

bool AsciiParser::CharN(size_t n, std::vector<char> *nc) {
  std::vector<char> buf(n);

  bool ok = _sr->read(n, n, reinterpret_cast<uint8_t *>(buf.data()));
  if (ok) {
    (*nc) = buf;
  }

  return ok;
}